

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

ssize_t __thiscall
nuraft::asio_rpc_client::send(asio_rpc_client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssl_socket *psVar1;
  tuple<std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  *this_00;
  element_type *peVar2;
  element_type *peVar3;
  pointer psVar4;
  pointer psVar5;
  element_type *peVar6;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *__tail_2;
  int iVar7;
  uint32_t uVar8;
  asio_service_impl *extraout_RAX;
  buffer *pbVar9;
  size_t sVar10;
  byte *pbVar11;
  asio_service_impl *paVar12;
  asio_rpc_client *paVar13;
  asio_service_impl *extraout_RAX_00;
  asio_service_impl *extraout_RAX_01;
  asio_service_impl *extraout_RAX_02;
  asio_service_impl *extraout_RAX_03;
  asio_service_impl *extraout_RAX_04;
  undefined8 uVar14;
  ptr<log_entry> *le;
  pointer psVar15;
  undefined1 *puVar16;
  pointer psVar17;
  uint uVar18;
  undefined4 in_register_00000034;
  shared_ptr<nuraft::req_msg> *psVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  char *pcVar20;
  bool bVar21;
  string meta_str;
  ptr<buffer> req_buf;
  ptr<asio_rpc_client> self;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  log_entry_bufs;
  buffer_serializer ss;
  shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
  local_268;
  buffer local_258 [24];
  undefined1 local_240 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  shared_ptr<nuraft::asio_rpc_client> local_218;
  shared_ptr<nuraft::req_msg> *local_208;
  asio_rpc_client *local_200;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_1f8;
  ptr<req_msg> local_1e0;
  ptr<asio_rpc_client> local_1d0;
  undefined1 local_1c0 [8];
  element_type *local_1b8;
  undefined1 local_1b0 [24];
  _Any_data local_198;
  asio_service_impl *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  _Head_base<0UL,_nuraft::asio_rpc_client_*,_false> local_158;
  char *local_f8;
  prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_f0;
  ssl_socket *local_e8;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *local_e0;
  BIO *local_d8;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  local_d0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>
  local_b0;
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>
  local_90;
  
  psVar19 = (shared_ptr<nuraft::req_msg> *)CONCAT44(in_register_00000034,__fd);
  local_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__n;
  if (((this->abandoned_)._M_base._M_i & 1U) != 0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar7 = (**(code **)(*(long *)peVar2 + 0x38))(), 1 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar20 = "disabled";
      if (this->ssl_enabled_ != false) {
        pcVar20 = "enabled";
      }
      msg_if_given_abi_cxx11_
                ((string *)local_1c0,"client %p to %s:%s is already stale (SSL %s)",this,
                 (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p,pcVar20);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"send",1000,(string *)local_1c0);
      if (local_1c0 != (undefined1  [8])local_1b0) {
        operator_delete((void *)local_1c0);
      }
    }
    local_268.
    super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_268.
    super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f8 = "abandoned client to %s";
    snprintf((char *)local_1c0,200,"abandoned client to %s",(this->host_)._M_dataplus._M_p);
    local_240._0_8_ = (rpc_exception *)0x0;
    local_1f8.
    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_240 + 8),
               (rpc_exception **)local_240,(allocator<nuraft::rpc_exception> *)&local_218,
               (char **)&local_1f8,psVar19);
    if (*(long *)((long)__buf + 0x10) == 0) {
      std::__throw_bad_function_call();
LAB_001a49c0:
      uVar14 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar14);
    }
    local_d0.super__Function_base._M_manager =
         (_Manager_type)(**(code **)((long)__buf + 0x18))(__buf,&local_268,local_240);
    local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_268.
            super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
      local_d0.super__Function_base._M_manager = (_Manager_type)extraout_RAX;
      local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_268.
              super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    }
    goto LAB_001a476b;
  }
  std::__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::asio_rpc_client,void>
            ((__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2> *)&local_218,
             (__weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<nuraft::asio_rpc_client>);
  psVar1 = &this->ssl_socket_;
  if ((((this->ssl_socket_).next_layer_)->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).
      impl_.implementation_.super_base_implementation_type.socket_ == -1) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar7 = (**(code **)(*(long *)peVar2 + 0x38))(), 4 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_1c0,"socket %p to %s:%s is not opened yet",this,
                 (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"send",0x3f5,local_1c0);
      if (local_1c0 != (undefined1  [8])local_1b0) {
        operator_delete((void *)local_1c0);
      }
    }
    LOCK();
    bVar21 = (this->attempting_conn_)._M_base._M_i == false;
    if (bVar21) {
      (this->attempting_conn_)._M_base._M_i = true;
    }
    UNLOCK();
    if (bVar21) {
      if ((psVar1->next_layer_->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
          implementation_.super_base_implementation_type.socket_ != -1) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar7 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar7)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_1c0,"race: socket to %s:%s is already opened, escape",
                     (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"send",0x417,local_1c0);
          if (local_1c0 != (undefined1  [8])local_1b0) {
            operator_delete((void *)local_1c0);
          }
        }
        goto LAB_001a3dc6;
      }
      paVar12 = this->impl_;
      if ((paVar12->my_opt_).custom_resolver_.super__Function_base._M_manager == (_Manager_type)0x0)
      {
        local_1d0.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_1d0.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((asio_rpc_client *)
            local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (asio_rpc_client *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((enable_shared_from_this<nuraft::asio_rpc_client> *)
                      &(local_218.
                        super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                     super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((enable_shared_from_this<nuraft::asio_rpc_client> *)
                           &(local_218.
                             super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                          super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((enable_shared_from_this<nuraft::asio_rpc_client> *)
                      &(local_218.
                        super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                     super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((enable_shared_from_this<nuraft::asio_rpc_client> *)
                           &(local_218.
                             super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                          super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 1;
          }
        }
        local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::function(&local_d0,
                   (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)__buf);
        execute_resolver(this,&local_1d0,&local_1e0,&this->host_,&this->port_,&local_d0,
                         (uint64_t)local_220._M_pi);
        if ((asio_service_impl *)local_d0.super__Function_base._M_manager !=
            (asio_service_impl *)0x0) {
          local_d0.super__Function_base._M_manager =
               (_Manager_type)(*local_d0.super__Function_base._M_manager)(&local_d0,&local_d0,3);
        }
        this_01._M_pi =
             local_1d0.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1e0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          local_d0.super__Function_base._M_manager = (_Manager_type)extraout_RAX_04;
          this_01._M_pi =
               local_1d0.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
      else {
        local_1b8 = local_218.
                    super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1b0._0_8_ =
             local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((asio_rpc_client *)
            local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (asio_rpc_client *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((enable_shared_from_this<nuraft::asio_rpc_client> *)
                      &(local_218.
                        super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                     super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((enable_shared_from_this<nuraft::asio_rpc_client> *)
                           &(local_218.
                             super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                          super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((enable_shared_from_this<nuraft::asio_rpc_client> *)
                      &(local_218.
                        super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                     super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((enable_shared_from_this<nuraft::asio_rpc_client> *)
                           &(local_218.
                             super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->_M_weak_this).
                          super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 1;
          }
        }
        local_1b0._8_8_ =
             (psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_1b0._16_8_ =
             (psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._16_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._16_8_)->_M_use_count +
                 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._16_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._16_8_)->_M_use_count +
                 1;
          }
        }
        local_1c0 = (undefined1  [8])this;
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)&local_198,
                   (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)__buf);
        local_178 = local_220._M_pi;
        std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)>
        ::
        function<nuraft::asio_rpc_client::send(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)_1_,void>
                  ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)>
                    *)&local_b0,(anon_class_80_5_44425651 *)local_1c0);
        if ((paVar12->my_opt_).custom_resolver_.super__Function_base._M_manager ==
            (_Manager_type)0x0) goto LAB_001a49c0;
        (*(paVar12->my_opt_).custom_resolver_._M_invoker)
                  ((_Any_data *)&(paVar12->my_opt_).custom_resolver_,&this->host_,&this->port_,
                   &local_b0);
        if ((per_timer_data *)local_b0.super__Function_base._M_manager != (per_timer_data *)0x0) {
          (*local_b0.super__Function_base._M_manager)(&local_b0,&local_b0,3);
        }
        if (local_188 != (asio_service_impl *)0x0) {
          local_188 = (asio_service_impl *)(*(code *)local_188)(&local_198,&local_198,3);
        }
        local_d0.super__Function_base._M_manager = (_Manager_type)local_188;
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._16_8_);
          local_d0.super__Function_base._M_manager = (_Manager_type)extraout_RAX_03;
          this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._0_8_;
        }
      }
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar7 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_1c0,
                   "cannot send req as other thread is racing on opening connection to (%s:%s), count %zu"
                   ,(this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p,
                   (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"send",0x401,local_1c0);
        if (local_1c0 != (undefined1  [8])local_1b0) {
          operator_delete((void *)local_1c0);
        }
      }
      LOCK();
      (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i =
           (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      local_268.
      super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,std::allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,asio::io_context&>
                (&local_268.
                  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  **)&local_268,
                 (allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                  *)local_1c0,&this->impl_->io_svc_);
      local_1c0 = (undefined1  [8])0x1dcd6500;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_after(local_268.
                      super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(duration *)local_1c0);
      peVar6 = local_268.
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_1c0 = (undefined1  [8])send_retry;
      local_1b8 = (element_type *)0x0;
      std::
      _Tuple_impl<1ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>>
      ::
      _Tuple_impl<std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&,void>
                ((_Tuple_impl<1ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>>
                  *)local_1b0,&local_218,&local_268,psVar19,
                 (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)__buf,(unsigned_long *)&local_220,(_Placeholder<1> *)&std::placeholders::_1);
      local_158._M_head_impl = this;
      asio::detail::
      deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
      ::
      async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>,asio::any_io_executor>
                (*(deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                   **)peVar6,(implementation_type *)((long)peVar6 + 8),
                 (_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                  *)local_1c0,(any_io_executor *)((long)peVar6 + 0x40));
      if ((object_fns *)local_160._M_pi != (object_fns *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
      }
      if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
      }
      if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_pi);
      }
      local_d0.super__Function_base._M_manager = (_Manager_type)local_198._M_unused._0_8_;
      this_01._M_pi =
           local_268.
           super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((asio_service_impl *)local_198._M_unused._0_8_ != (asio_service_impl *)0x0) {
        local_d0.super__Function_base._M_manager =
             (_Manager_type)
             (*local_198._M_unused._M_function_pointer)(local_1b0 + 8,local_1b0 + 8,3);
        this_01._M_pi =
             local_268.
             super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      }
    }
  }
  else {
LAB_001a3dc6:
    if ((this->ssl_enabled_ != true) || (((this->ssl_ready_)._M_base._M_i & 1U) != 0)) {
      set_busy_flag(this,true);
      iVar7 = 0;
      LOCK();
      (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      local_1f8.
      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.
      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.
      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar12 = this->impl_;
      bVar21 = (paVar12->my_opt_).replicate_log_timestamp_;
      uVar18 = (uint)bVar21;
      peVar3 = (psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar15 = (peVar3->log_entries_).
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = (peVar3->log_entries_).
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_208 = psVar19;
      local_e8 = psVar1;
      local_e0 = (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)__buf;
      if (psVar15 != psVar4) {
        local_d8 = (BIO *)((long)(ulong)bVar21 * 8 + 0xd);
        iVar7 = 0;
        local_200 = this;
        local_f0 = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)(ulong)bVar21;
        do {
          pbVar9 = log_entry::get_buf((psVar15->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr);
          sVar10 = buffer::size(pbVar9);
          buffer::alloc((buffer *)&local_268,(size_t)(local_d8 + sVar10));
          buffer_serializer::buffer_serializer
                    ((buffer_serializer *)local_1c0,(ptr<buffer> *)&local_268,LITTLE);
          buffer_serializer::put_u64
                    ((buffer_serializer *)local_1c0,
                     ((psVar15->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->term_);
          buffer_serializer::put_u8
                    ((buffer_serializer *)local_1c0,
                     ((psVar15->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->value_type_);
          if ((local_200->impl_->my_opt_).replicate_log_timestamp_ == true) {
            buffer_serializer::put_u64
                      ((buffer_serializer *)local_1c0,
                       ((psVar15->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr)->timestamp_us_);
          }
          pbVar9 = log_entry::get_buf((psVar15->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr);
          sVar10 = buffer::size(pbVar9);
          buffer_serializer::put_i32((buffer_serializer *)local_1c0,(int32_t)sVar10);
          pbVar9 = log_entry::get_buf((psVar15->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr);
          pbVar11 = buffer::data_begin(pbVar9);
          pbVar9 = log_entry::get_buf((psVar15->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr);
          sVar10 = buffer::size(pbVar9);
          buffer_serializer::put_raw((buffer_serializer *)local_1c0,pbVar11,sVar10);
          std::
          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          ::push_back(&local_1f8,(value_type *)&local_268);
          sVar10 = buffer::size((buffer *)
                                local_268.
                                super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
          if ((asio_rpc_client *)
              local_268.
              super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (asio_rpc_client *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_268.
                       super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          iVar7 = iVar7 + (int)sVar10;
          psVar15 = psVar15 + 1;
        } while (psVar15 != psVar4);
        paVar12 = local_200->impl_;
        uVar18 = (uint)local_f0;
        this = local_200;
      }
      uVar18 = uVar18 << 2;
      local_268.
      super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_258;
      local_268.
      super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_258[0] = (buffer)0x0;
      if ((paVar12->my_opt_).write_req_meta_.super__Function_base._M_manager == (_Manager_type)0x0)
      {
LAB_001a4166:
        puVar16 = (undefined1 *)0x0;
      }
      else {
        peVar3 = (local_208->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        local_198._M_unused._0_8_ = (undefined8)peVar3->commit_idx_;
        local_1b0._0_8_ = (peVar3->super_msg_base).term_;
        local_1c0 = *(undefined1 (*) [8])&(peVar3->super_msg_base).type_;
        local_1b8 = (element_type *)CONCAT44(local_1b8._4_4_,(peVar3->super_msg_base).dst_);
        local_1b0._8_8_ = peVar3->last_log_term_;
        local_1b0._16_8_ = peVar3->last_log_idx_;
        (*(paVar12->my_opt_).write_req_meta_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                   (_Any_data *)&(paVar12->my_opt_).write_req_meta_,
                   (asio_service_meta_cb_params *)local_1c0);
        std::__cxx11::string::operator=((string *)&local_268,(string *)local_240);
        if ((rpc_exception *)local_240._0_8_ != (rpc_exception *)(local_240 + 0x10)) {
          operator_delete((void *)local_240._0_8_);
        }
        if ((asio_rpc_client *)
            local_268.
            super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi == (asio_rpc_client *)0x0) goto LAB_001a4166;
        uVar18 = uVar18 | 1;
        puVar16 = (undefined1 *)
                  ((long)&((rpc_client *)
                          &(local_268.
                            super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base)->_vptr_rpc_client + 4);
      }
      buffer::alloc((buffer *)local_240,(size_t)(puVar16 + (long)iVar7 + 0x36));
      buffer::pos((buffer *)local_240._0_8_,0);
      pbVar11 = buffer::data((buffer *)local_240._0_8_);
      buffer::put((buffer *)local_240._0_8_,'\0');
      psVar19 = local_208;
      buffer::put((buffer *)local_240._0_8_,
                  (char)(((local_208->
                          super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                        super_msg_base).type_);
      buffer::put((buffer *)local_240._0_8_,
                  (((psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_msg_base).src_);
      buffer::put((buffer *)local_240._0_8_,
                  (((psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_msg_base).dst_);
      buffer::put((buffer *)local_240._0_8_,
                  (((psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_msg_base).term_);
      buffer::put((buffer *)local_240._0_8_,
                  ((psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->last_log_term_);
      buffer::put((buffer *)local_240._0_8_,
                  ((psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->last_log_idx_);
      buffer::put((buffer *)local_240._0_8_,
                  ((psVar19->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->commit_idx_);
      buffer::put((buffer *)local_240._0_8_,iVar7 + (int)puVar16);
      uVar8 = crc32_8(pbVar11,0x2e,0);
      buffer::put((buffer *)local_240._0_8_,CONCAT44(uVar18,uVar8));
      __tail_2 = local_e0;
      psVar1 = local_e8;
      psVar17 = local_1f8.
                super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = local_1f8.
               super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((uVar18 & 1) != 0) {
        buffer::put((buffer *)local_240._0_8_,
                    (byte *)local_268.
                            super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,
                    (size_t)local_268.
                            super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        psVar17 = local_1f8.
                  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = local_1f8.
                 super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; psVar17 != psVar5; psVar17 = psVar17 + 1) {
        buffer::put((buffer *)local_240._0_8_,
                    (psVar17->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   );
      }
      buffer::pos((buffer *)local_240._0_8_,0);
      if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_1c0 = (undefined1  [8])((long)local_220._M_pi * 1000000);
        asio::
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
        ::expires_after(&this->operation_timer_,(duration *)local_1c0);
        local_1c0 = (undefined1  [8])cancel_socket;
        local_1b8 = (element_type *)0x0;
        local_1b0._0_8_ = this;
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
        ::
        async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>))(std::error_code_const&)>,asio::any_io_executor>
                  ((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                    *)(this->operation_timer_).impl_.service_,
                   &(this->operation_timer_).impl_.implementation_,
                   (_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>
                    *)local_1c0,&(this->operation_timer_).impl_.executor_);
      }
      bVar21 = this->ssl_enabled_;
      paVar13 = (asio_rpc_client *)buffer::data((buffer *)local_240._0_8_);
      local_1b8 = (element_type *)buffer::size((buffer *)local_240._0_8_);
      this_00 = &local_90._M_bound_args;
      local_90._M_f = (offset_in_asio_rpc_client_to_subr)sent;
      local_90._8_8_ = 0;
      local_1c0 = (undefined1  [8])paVar13;
      std::
      _Tuple_impl<0ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>>
      ::
      _Tuple_impl<std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
                ((_Tuple_impl<0ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>>
                  *)this_00,&local_218,local_208,(shared_ptr<nuraft::buffer> *)local_240,__tail_2,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                );
      aa::
      write<asio::mutable_buffers_1,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>
                (bVar21,psVar1,&this->socket_,(mutable_buffers_1 *)local_1c0,&local_90);
      if ((wait_op *)
          local_90._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .super__Head_base<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_false>._M_head_impl.
          super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (wait_op *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90._M_bound_args.
                   super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                   .super__Head_base<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_false>.
                   _M_head_impl.
                   super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_90._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .super__Head_base<1UL,_std::shared_ptr<nuraft::req_msg>,_false>._M_head_impl.
          super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90._M_bound_args.
                   super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                   .
                   super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                   .super__Head_base<1UL,_std::shared_ptr<nuraft::req_msg>,_false>._M_head_impl.
                   super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      if ((service_type *)
          local_90._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<2UL,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .super__Head_base<2UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (service_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90._M_bound_args.
                   super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                   .
                   super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                   .
                   super__Tuple_impl<2UL,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                   .super__Head_base<2UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
                   super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      if (local_90._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<2UL,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<3UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Head_base<3UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
          ._M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_90._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<2UL,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Tuple_impl<3UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .
          super__Head_base<3UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
          ._M_head_impl.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
      }
      if ((buffer *)
          local_268.
          super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != local_258) {
        operator_delete(local_268.
                        super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
      }
      std::
      vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
      ~vector(&local_1f8);
      local_d0.super__Function_base._M_manager = (_Manager_type)extraout_RAX_00;
      goto LAB_001a476b;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar7 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_1c0,"cannot send req as SSL is not ready yet (%s:%s), count %zu",
                 (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p,
                 (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"send",0x441,local_1c0);
      if (local_1c0 != (undefined1  [8])local_1b0) {
        operator_delete((void *)local_1c0);
      }
    }
    LOCK();
    (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i =
         (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    local_268.
    super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,std::allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,asio::io_context&>
              (&local_268.
                super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                **)&local_268,
               (allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                *)local_1c0,&this->impl_->io_svc_);
    local_1c0 = (undefined1  [8])0x1dcd6500;
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::expires_after(local_268.
                    super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(duration *)local_1c0);
    peVar6 = local_268.
             super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_1c0 = (undefined1  [8])send_retry;
    local_1b8 = (element_type *)0x0;
    std::
    _Tuple_impl<1ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>>
    ::
    _Tuple_impl<std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&,void>
              ((_Tuple_impl<1ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>>
                *)local_1b0,&local_218,&local_268,psVar19,
               (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)__buf,(unsigned_long *)&local_220,(_Placeholder<1> *)&std::placeholders::_1);
    local_158._M_head_impl = this;
    asio::detail::
    deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
    ::
    async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>,asio::any_io_executor>
              (*(deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                 **)peVar6,(implementation_type *)((long)peVar6 + 8),
               (_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                *)local_1c0,(any_io_executor *)((long)peVar6 + 0x40));
    if ((object_fns *)local_160._M_pi != (object_fns *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
    }
    if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
    }
    if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_pi);
    }
    local_d0.super__Function_base._M_manager = (_Manager_type)local_198._M_unused._0_8_;
    this_01._M_pi =
         local_268.
         super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((asio_service_impl *)local_198._M_unused._0_8_ != (asio_service_impl *)0x0) {
      local_d0.super__Function_base._M_manager =
           (_Manager_type)(*local_198._M_unused._M_function_pointer)(local_1b0 + 8,local_1b0 + 8,3);
      this_01._M_pi =
           local_268.
           super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
  }
  if ((asio_rpc_client *)this_01._M_pi != (asio_rpc_client *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    local_d0.super__Function_base._M_manager = (_Manager_type)extraout_RAX_01;
  }
LAB_001a476b:
  if ((asio_rpc_client *)
      local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (asio_rpc_client *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    local_d0.super__Function_base._M_manager = (_Manager_type)extraout_RAX_02;
  }
  return (ssize_t)local_d0.super__Function_base._M_manager;
}

Assistant:

virtual void send(ptr<req_msg>& req,
                      rpc_handler& when_done,
                      uint64_t send_timeout_ms = 0) __override__
    {
        if (abandoned_) {
            p_er( "client %p to %s:%s is already stale (SSL %s)",
                  this, host_.c_str(), port_.c_str(),
                  ( ssl_enabled_ ? "enabled" : "disabled" ) );
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
               ( cs_new<rpc_exception>
                 ( lstrfmt("abandoned client to %s").fmt(host_.c_str()),
                   req ) );
            when_done(rsp, except);
            return;
        }

        ptr<asio_rpc_client> self = this->shared_from_this();
        while (!socket().is_open()) { // Dummy one-time loop
            p_db( "socket %p to %s:%s is not opened yet",
                  this, host_.c_str(), port_.c_str() );

            // WARNING:
            //   Only one thread can establish connection at a time.
            //   Since we don't re-use RPC client upon connection failure,
            //   this flag will never be cleared.
            bool exp = false;
            bool desired = true;
            if (!attempting_conn_.compare_exchange_strong(exp, desired)) {
                // Other thread is attempting connection, just wait.
                p_wn( "cannot send req as other thread is racing on opening "
                      "connection to (%s:%s), count %zu",
                      host_.c_str(), port_.c_str(), num_send_fails_.load() );
                num_send_fails_.fetch_add(1);

                ptr<asio::steady_timer> timer =
                    cs_new<asio::steady_timer>(impl_->get_io_svc());
                timer->expires_after
                       ( std::chrono::duration_cast<std::chrono::nanoseconds>
                         ( std::chrono::milliseconds( SEND_RETRY_MS ) ) );
                timer->async_wait( std::bind( &asio_rpc_client::send_retry,
                                              this,
                                              self,
                                              timer,
                                              req,
                                              when_done,
                                              send_timeout_ms,
                                              std::placeholders::_1 ) );
                return;
            }

            if (socket().is_open()) {
                // Already opened, skip async_connect.
                p_wn("race: socket to %s:%s is already opened, escape",
                     host_.c_str(), port_.c_str());
                break;
            }

            if (impl_->get_options().custom_resolver_) {
                impl_->get_options().custom_resolver_(
                    host_,
                    port_,
                    [this, self, req, when_done, send_timeout_ms]
                    ( const std::string& resolved_host,
                      const std::string& resolved_port,
                      std::error_code err ) {
                        if (!err) {
                            p_in( "custom resolver: %s:%s to %s:%s",
                                  host_.c_str(), port_.c_str(),
                                  resolved_host.c_str(), resolved_port.c_str() );
                            execute_resolver(self, req, resolved_host, resolved_port,
                                             when_done, send_timeout_ms);
                        } else {
                            ptr<resp_msg> rsp;
                            ptr<rpc_exception> except
                               ( cs_new<rpc_exception>
                                       ( lstrfmt("failed to resolve host %s by given "
                                                 "custom resolver "
                                                 "due to error %d, %s")
                                                .fmt( host_.c_str(),
                                                      err.value(),
                                                      err.message().c_str() ),
                                         req ) );
                            when_done(rsp, except);
                        }
                    } );
            } else {
                execute_resolver(self, req, host_, port_, when_done, send_timeout_ms);
            }
            return;
        }

        if (ssl_enabled_ && !ssl_ready_) {
            // TCP socket is opened, but SSL handshake is not done yet.
            // Since other thread is doing it, this thread should just wait.
            p_wn( "cannot send req as SSL is not ready yet (%s:%s), count %zu",
                  host_.c_str(), port_.c_str(), num_send_fails_.load() );
            num_send_fails_.fetch_add(1);

            ptr<asio::steady_timer> timer =
                cs_new<asio::steady_timer>(impl_->get_io_svc());
            timer->expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( SEND_RETRY_MS ) ) );
            timer->async_wait( std::bind( &asio_rpc_client::send_retry,
                                          this,
                                          self,
                                          timer,
                                          req,
                                          when_done,
                                          send_timeout_ms,
                                          std::placeholders::_1 ) );
            return;
        }

        // Socket should be idle now. If not, it should be a bug.
        set_busy_flag(true);

        // If we reach here, that means connection is valid.
        // Reset the counter.
        num_send_fails_ = 0;

        // serialize req, send and read response
        std::vector<ptr<buffer>> log_entry_bufs;
        int32 log_data_size(0);

        uint32_t flags = 0x0;
        size_t LOG_ENTRY_SIZE = 8 + 1 + 4;
        if (impl_->get_options().replicate_log_timestamp_) {
            LOG_ENTRY_SIZE += 8;
            flags |= INCLUDE_LOG_TIMESTAMP;
        }

        for (auto& entry: req->log_entries()) {
            ptr<log_entry>& le = entry;
            ptr<buffer> entry_buf = buffer::alloc
                                    ( LOG_ENTRY_SIZE + le->get_buf().size() );
#if 0
            entry_buf->put( le->get_term() );
            entry_buf->put( (byte)le->get_val_type() );
            entry_buf->put( (int32)le->get_buf().size() );
            le->get_buf().pos(0);
            entry_buf->put( le->get_buf() );
            entry_buf->pos( 0 );
#else
            buffer_serializer ss(entry_buf);
            ss.put_u64( le->get_term() );
            ss.put_u8( le->get_val_type() );
            if (impl_->get_options().replicate_log_timestamp_) {
                ss.put_u64( le->get_timestamp() );
            }
            ss.put_i32( le->get_buf().size() );
            ss.put_raw( le->get_buf().data_begin(), le->get_buf().size() );
#endif
            log_entry_bufs.push_back(entry_buf);
            log_data_size += (int32)entry_buf->size();
        }

        size_t meta_size = 0;
        std::string meta_str;
        if (impl_->get_options().write_req_meta_) {
            meta_str = impl_->get_options().write_req_meta_( req_to_params(req) );
            if (!meta_str.empty()) {
                // If callback for meta is given, set flag.
                flags |= INCLUDE_META;
                meta_size = sizeof(int32) + meta_str.size();
            }
        }

        ptr<buffer> req_buf =
            buffer::alloc(RPC_REQ_HEADER_SIZE + meta_size + log_data_size);

        req_buf->pos(0);
        byte* req_buf_data = req_buf->data();

        byte marker = 0x0;
        req_buf->put(marker);
        req_buf->put((byte)req->get_type());
        req_buf->put(req->get_src());
        req_buf->put(req->get_dst());
        req_buf->put(req->get_term());
        req_buf->put(req->get_last_log_term());
        req_buf->put(req->get_last_log_idx());
        req_buf->put(req->get_commit_idx());
        req_buf->put((int32)meta_size + log_data_size);

        // Calculate CRC32 on header-only.
        uint32_t crc_val = crc32_8( req_buf_data,
                                    RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN,
                                    0 );

        uint64_t flags_and_crc = ((uint64_t)flags << 32) | crc_val;
        req_buf->put((ulong)flags_and_crc);

        // Handling meta if the flag is set.
        if (flags & INCLUDE_META) {
            req_buf->put( (byte*)meta_str.data(), meta_str.size() );
        }

        for (auto& it: log_entry_bufs) {
            req_buf->put(*(it));
        }
        req_buf->pos(0);

        if (send_timeout_ms != 0)
        {
            operation_timer_.expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( send_timeout_ms ) ) );
            operation_timer_.async_wait( std::bind( &asio_rpc_client::cancel_socket,
                                                    this,
                                                    std::placeholders::_1 ) );
        }


        // Note: without passing `req_buf` to callback function, it will be
        //       unreachable before the write is done so that it is freed
        //       and the memory corruption will occur.
        aa::write( ssl_enabled_, ssl_socket_, socket_,
                   asio::buffer(req_buf->data(), req_buf->size()),
                   std::bind( &asio_rpc_client::sent,
                              self,
                              req,
                              req_buf,
                              when_done,
                              std::placeholders::_1,
                              std::placeholders::_2 ) );
    }